

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  FuncState *fs_00;
  int dest;
  int iVar1;
  uint uVar2;
  
  if (list != -1) {
    do {
      fs_00 = (FuncState *)fs->f->code;
      uVar2 = *(uint *)((long)&fs_00->f + (long)list * 4) >> 0xe;
      iVar1 = patchtestreg(fs_00,list,reg);
      dest = vtarget;
      if (iVar1 == 0) {
        dest = dtarget;
      }
      fixjump(fs,list,dest);
    } while ((uVar2 != 0x1fffe) && (list = list + uVar2 + -0x1fffe, list != -1));
  }
  return;
}

Assistant:

static void patchlistaux(FuncState *fs, int list, int vtarget, int reg,
                         int dtarget) {
    while (list != NO_JUMP) {
        int next = getjump(fs, list);
        if (patchtestreg(fs, list, reg))
            fixjump(fs, list, vtarget);
        else
            fixjump(fs, list, dtarget);  /* jump to default target */
        list = next;
    }
}